

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O1

shared_ptr<nigel::IM_Command> __thiscall
nigel::IMC_Generator::generateCmd
          (IMC_Generator *this,HexOp operation,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::IM_Operator> *rOp)

{
  _List_node_base *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nigel::IM_Command> sVar2;
  
  (this->super_BuilderExecutable)._vptr_BuilderExecutable = (_func_int **)0x0;
  p_Var1 = (_List_node_base *)operator_new(0x60);
  p_Var1->_M_prev = (_List_node_base *)0x100000001;
  p_Var1->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_0018a648;
  *(undefined4 *)&p_Var1[1]._M_next = 0;
  p_Var1[1]._M_prev = (_List_node_base *)0x0;
  p_Var1[2]._M_next = (_List_node_base *)0x0;
  p_Var1[2]._M_prev = (_List_node_base *)0x0;
  p_Var1[3]._M_next = (_List_node_base *)0x0;
  *(undefined4 *)&p_Var1[3]._M_prev = 0;
  p_Var1[4]._M_next = p_Var1 + 5;
  p_Var1[4]._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var1[5]._M_next = 0;
  (this->super_BuilderExecutable).notificationList.
  super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = p_Var1;
  (this->super_BuilderExecutable)._vptr_BuilderExecutable = (_func_int **)(p_Var1 + 1);
  p_Var1[1]._M_prev =
       (_List_node_base *)
       (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 2),
             &(lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
  ;
  p_Var1[2]._M_prev =
       (_List_node_base *)
       (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 3),
             &(rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
  ;
  *(HexOp *)((long)&p_Var1[1]._M_next + 4) = operation;
  sVar2.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<nigel::IM_Command>)
         sVar2.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IM_Command> IMC_Generator::generateCmd( HexOp operation, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp )
	{
		auto cmd = std::make_shared<IM_Command>();
		cmd->op1 = lOp;
		cmd->op2 = rOp;
		cmd->operation = operation;
		return cmd;
	}